

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateSequence(ExpressionContext *ctx,SynBase *source,ExprBase *first,ExprBase *second,
              ExprBase *third)

{
  int iVar1;
  undefined4 extraout_var;
  ArrayView<ExprBase_*> arr;
  ExprBase *third_local;
  ExprBase *second_local;
  SmallArray<ExprBase_*,_3U> expressions;
  ExprBase *first_local;
  
  expressions.allocator = ctx->allocator;
  expressions.data = expressions.little;
  expressions.count = 0;
  expressions.max = 3;
  third_local = third;
  second_local = second;
  first_local = first;
  SmallArray<ExprBase_*,_3U>::push_back(&expressions,&first_local);
  SmallArray<ExprBase_*,_3U>::push_back(&expressions,&second_local);
  SmallArray<ExprBase_*,_3U>::push_back(&expressions,&third_local);
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
  arr.count = expressions.count;
  arr.data = expressions.data;
  arr._12_4_ = 0;
  ExprSequence::ExprSequence
            ((ExprSequence *)CONCAT44(extraout_var,iVar1),ctx->allocator,source,third_local->type,
             arr);
  SmallArray<ExprBase_*,_3U>::~SmallArray(&expressions);
  return &((ExprSequence *)CONCAT44(extraout_var,iVar1))->super_ExprBase;
}

Assistant:

ExprBase* CreateSequence(ExpressionContext &ctx, SynBase *source, ExprBase *first, ExprBase *second, ExprBase *third)
{
	SmallArray<ExprBase*, 3> expressions(ctx.allocator);

	expressions.push_back(first);
	expressions.push_back(second);
	expressions.push_back(third);

	return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, third->type, expressions);
}